

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.h
# Opt level: O2

void __thiscall uWS::HttpContext<true>::free(HttpContext<true> *this,void *__ptr)

{
  HttpContextData<false> *this_00;
  
  this_00 = getSocketContextData(this);
  HttpContextData<true>::~HttpContextData((HttpContextData<true> *)this_00);
  us_socket_context_free(1,this);
  return;
}

Assistant:

void free() {
        /* Destruct socket context data */
        HttpContextData<SSL> *httpContextData = getSocketContextData();
        httpContextData->~HttpContextData<SSL>();

        /* Free the socket context in whole */
        us_socket_context_free(SSL, getSocketContext());
    }